

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O0

bool __thiscall
argstest::ArgumentParser::
ParseLong<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
          (ArgumentParser *this,
          __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *it,__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              end)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  bool bVar1;
  int iVar2;
  reference pbVar3;
  ulong uVar4;
  undefined4 extraout_var;
  ulong local_158;
  undefined1 local_140 [8];
  string errorMessage_1;
  undefined1 local_110 [8];
  string errorMessage;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  values;
  FlagBase *flag;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> joined;
  undefined1 local_78 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> arg;
  size_type separator;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> argchunk;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *chunk;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *it_local;
  ArgumentParser *this_local;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  end_local;
  FlagBase *flag_00;
  
  pbVar3 = __gnu_cxx::
           __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator*(it);
  argchunk.field_2._8_8_ = pbVar3;
  std::__cxx11::string::size();
  std::__cxx11::string::substr((ulong)&separator,(ulong)pbVar3);
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    local_158 = std::__cxx11::string::find((string *)&separator,(ulong)&this->longseparator);
  }
  else {
    local_158 = 0xffffffffffffffff;
  }
  arg.field_2._8_8_ = local_158;
  if (local_158 == 0xffffffffffffffff) {
    std::__cxx11::string::string((string *)local_78,(string *)&separator);
  }
  else {
    std::__cxx11::string::string((string *)local_78,(string *)&separator,0,local_158);
  }
  if (arg.field_2._8_8_ == -1) {
    std::__cxx11::string::string((string *)&flag);
  }
  else {
    std::__cxx11::string::size();
    std::__cxx11::string::substr((ulong)&flag,(ulong)&separator);
  }
  EitherFlag::EitherFlag
            ((EitherFlag *)
             &values.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)local_78);
  iVar2 = (*(this->super_Command).super_Group.super_Base._vptr_Base[7])
                    (this,&values.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
  flag_00 = (FlagBase *)CONCAT44(extraout_var,iVar2);
  EitherFlag::~EitherFlag
            ((EitherFlag *)
             &values.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  if (flag_00 == (FlagBase *)0x0) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_140,
                   "Flag could not be matched: ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78);
    (this->super_Command).super_Group.super_Base.error = Parse;
    std::__cxx11::string::operator=
              ((string *)&(this->super_Command).super_Group.super_Base.errorMsg,(string *)local_140)
    ;
    end_local._M_current._7_1_ = 0;
    errorMessage_1.field_2._12_4_ = 1;
    std::__cxx11::string::~string((string *)local_140);
  }
  else {
    this_00 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&errorMessage.field_2 + 8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(this_00);
    ParseArgsValues<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
              ((string *)local_110,this,flag_00,(string *)local_78,it,end,
               (bool)(this->allowSeparateLongValue & 1),(bool)(this->allowJoinedLongValue & 1),
               arg.field_2._8_8_ != -1,(string *)&flag,false,this_00);
    uVar4 = std::__cxx11::string::empty();
    if ((uVar4 & 1) == 0) {
      (this->super_Command).super_Group.super_Base.error = Parse;
      std::__cxx11::string::operator=
                ((string *)&(this->super_Command).super_Group.super_Base.errorMsg,
                 (string *)local_110);
      end_local._M_current._7_1_ = 0;
      errorMessage_1.field_2._12_4_ = 1;
    }
    else {
      if ((this->readCompletion & 1U) == 0) {
        (*(flag_00->super_NamedBase).super_Base._vptr_Base[0x16])
                  (flag_00,(undefined1 *)((long)&errorMessage.field_2 + 8));
      }
      bVar1 = Base::KickOut((Base *)flag_00);
      if (bVar1) {
        __gnu_cxx::
        __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(it);
        end_local._M_current._7_1_ = 0;
        errorMessage_1.field_2._12_4_ = 1;
      }
      else {
        errorMessage_1.field_2._12_4_ = 0;
      }
    }
    std::__cxx11::string::~string((string *)local_110);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&errorMessage.field_2 + 8));
    if (errorMessage_1.field_2._12_4_ == 0) {
      end_local._M_current._7_1_ = 1;
      errorMessage_1.field_2._12_4_ = 1;
    }
  }
  std::__cxx11::string::~string((string *)&flag);
  std::__cxx11::string::~string((string *)local_78);
  std::__cxx11::string::~string((string *)&separator);
  return (bool)(end_local._M_current._7_1_ & 1);
}

Assistant:

bool ParseLong(It &it, It end)
            {
                const auto &chunk = *it;
                const auto argchunk = chunk.substr(longprefix.size());
                // Try to separate it, in case of a separator:
                const auto separator = longseparator.empty() ? argchunk.npos : argchunk.find(longseparator);
                // If the separator is in the argument, separate it.
                const auto arg = (separator != argchunk.npos ?
                    std::string(argchunk, 0, separator)
                    : argchunk);
                const auto joined = (separator != argchunk.npos ?
                    argchunk.substr(separator + longseparator.size())
                    : std::string());

                if (auto flag = Match(arg))
                {
                    std::vector<std::string> values;
                    const std::string errorMessage = ParseArgsValues(*flag, arg, it, end, allowSeparateLongValue, allowJoinedLongValue,
                                                                     separator != argchunk.npos, joined, false, values);
                    if (!errorMessage.empty())
                    {
#ifndef ARGS_NOEXCEPT
                        throw ParseError(errorMessage);
#else
                        error = Error::Parse;
                        errorMsg = errorMessage;
                        return false;
#endif
                    }

                    if (!readCompletion)
                    {
                        flag->ParseValue(values);
                    }

                    if (flag->KickOut())
                    {
                        ++it;
                        return false;
                    }
                } else
                {
                    const std::string errorMessage("Flag could not be matched: " + arg);
#ifndef ARGS_NOEXCEPT
                    throw ParseError(errorMessage);
#else
                    error = Error::Parse;
                    errorMsg = errorMessage;
                    return false;
#endif
                }

                return true;
            }